

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DJB.cpp
# Opt level: O3

uint32_t __thiscall llvm::caseFoldingDjbHash(llvm *this,StringRef Buffer,uint32_t H)

{
  llvm lVar1;
  byte *pbVar2;
  ConversionResult CVar3;
  uint32_t uVar4;
  llvm *plVar5;
  uint uVar6;
  uint32_t uVar7;
  llvm *plVar8;
  bool bVar9;
  byte local_4c [4];
  llvm *plStack_48;
  array<unsigned_char,_4UL> Storage;
  UTF8 *Begin8;
  uint local_34;
  UTF32 local_30;
  UTF32 C;
  
  plVar8 = (llvm *)Buffer.Data;
  uVar4 = (uint32_t)Buffer.Length;
  uVar7 = uVar4;
  if (plVar8 != (llvm *)0x0) {
    bVar9 = true;
    plVar5 = (llvm *)0x0;
    do {
      lVar1 = this[(long)plVar5];
      uVar6 = (byte)lVar1 + 0x20;
      if (0x19 < (byte)((char)lVar1 + 0xbfU)) {
        uVar6 = (uint)(byte)lVar1;
      }
      uVar7 = uVar6 + uVar7 * 0x21;
      bVar9 = (bool)(bVar9 & -1 < (char)lVar1);
      plVar5 = plVar5 + 1;
    } while (plVar8 != plVar5);
    if ((!bVar9) && (uVar7 = uVar4, plVar8 != (llvm *)0x0)) {
      do {
        Begin8 = (UTF8 *)&local_34;
        plStack_48 = this;
        ConvertUTF8toUTF32((UTF8 **)&stack0xffffffffffffffb8,(UTF8 *)(this + (long)plVar8),
                           (UTF32 **)&Begin8,&local_30,lenientConversion);
        plVar5 = plStack_48 + -(long)this;
        bVar9 = plVar8 < plVar5;
        plVar8 = plVar8 + -(long)plVar5;
        if (bVar9) {
          __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                        ,0x281,"StringRef llvm::StringRef::drop_front(size_t) const");
        }
        uVar6 = 0x69;
        if ((local_34 & 0xfffffffe) != 0x130) {
          uVar6 = sys::unicode::foldCharSimple(local_34);
        }
        plStack_48 = (llvm *)&local_34;
        Begin8 = local_4c;
        local_34 = uVar6;
        CVar3 = ConvertUTF32toUTF8((UTF32 **)&stack0xffffffffffffffb8,&local_30,&Begin8,
                                   (UTF8 *)&stack0xffffffffffffffb8,strictConversion);
        pbVar2 = local_4c;
        if (CVar3 != conversionOK) {
          __assert_fail("CR == conversionOK && \"Case folding produced invalid char?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DJB.cpp"
                        ,0x2d,"StringRef toUTF8(UTF32, MutableArrayRef<UTF8>)");
        }
        for (; Begin8 != pbVar2; pbVar2 = pbVar2 + 1) {
          uVar4 = uVar4 * 0x21 + (uint)*pbVar2;
        }
        this = this + (long)plVar5;
        uVar7 = uVar4;
      } while (plVar8 != (llvm *)0x0);
    }
  }
  return uVar7;
}

Assistant:

uint32_t llvm::caseFoldingDjbHash(StringRef Buffer, uint32_t H) {
  if (Optional<uint32_t> Result = fastCaseFoldingDjbHash(Buffer, H))
    return *Result;

  std::array<UTF8, UNI_MAX_UTF8_BYTES_PER_CODE_POINT> Storage;
  while (!Buffer.empty()) {
    UTF32 C = foldCharDwarf(chopOneUTF32(Buffer));
    StringRef Folded = toUTF8(C, Storage);
    H = djbHash(Folded, H);
  }
  return H;
}